

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Irrlicht.cpp
# Opt level: O0

bool isDriverSupported(E_DRIVER_TYPE driver)

{
  E_DRIVER_TYPE driver_local;
  undefined1 local_1;
  
  if (driver == EDT_NULL) {
    local_1 = true;
  }
  else if (driver == EDT_OPENGL) {
    local_1 = true;
  }
  else if (driver == EDT_OPENGL3) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

IRRLICHT_API bool IRRCALLCONV isDriverSupported(E_DRIVER_TYPE driver)
{
	switch (driver) {
	case EDT_NULL:
		return true;
#ifdef ENABLE_OPENGL3
	case EDT_OPENGL3:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_OPENGL_
	case EDT_OPENGL:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_OGLES1_
	case EDT_OGLES1:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_OGLES2_
	case EDT_OGLES2:
		return true;
#endif
#ifdef _IRR_COMPILE_WITH_WEBGL1_
	case EDT_WEBGL1:
		return true;
#endif
	default:
		return false;
	}
}